

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Opnd * __thiscall IR::Instr::UnlinkDst(Instr *this)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  _func_int **pp_Var7;
  
  this_00 = this->m_dst;
  OVar2 = Opnd::GetKind(this_00);
  OVar3 = Opnd::GetKind(this_00);
  if (OVar2 == OpndKindReg) {
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004b162c;
      *puVar6 = 0;
    }
    pp_Var7 = this_00[1]._vptr_Opnd;
    if (pp_Var7 != (_func_int **)0x0) {
LAB_004b153c:
      if (((ulong)pp_Var7[3] & 1) != 0) {
        if ((Instr *)pp_Var7[5] == this) {
          pp_Var7[5] = (_func_int *)0x0;
        }
        else if (-1 < (char)this_00->field_0xb) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x8fe,"(oldDst->isFakeDst)","oldDst->isFakeDst");
          if (!bVar4) goto LAB_004b162c;
          *puVar6 = 0;
        }
      }
    }
  }
  else if (OVar3 == OpndKindSym) {
    OVar2 = Opnd::GetKind(this_00);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_004b162c;
      *puVar6 = 0;
    }
    pp_Var7 = this_00[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var7 + 0x14) == '\x01') goto LAB_004b153c;
  }
  bVar5 = this_00->field_0xb;
  if ((char)bVar5 < '\0') {
    bVar5 = bVar5 & 0x7f;
    this_00->field_0xb = bVar5;
  }
  if ((bVar5 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x2a,"(m_inUse)","Expected inUse to be set...");
    if (!bVar4) {
LAB_004b162c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    bVar5 = this_00->field_0xb;
  }
  this_00->field_0xb = bVar5 & 0xfd;
  this->m_dst = (Opnd *)0x0;
  return this_00;
}

Assistant:

Opnd *
Instr::UnlinkDst()
{
    Opnd * oldDst = this->m_dst;
    StackSym *stackSym = nullptr;

    // If oldDst isSingleDef, clear instrDef

    if (oldDst->IsRegOpnd())
    {
        stackSym = oldDst->AsRegOpnd()->m_sym;
    }
    else if (oldDst->IsSymOpnd())
    {
        Sym *sym = oldDst->AsSymOpnd()->m_sym;
        if (sym->IsStackSym())
        {
            stackSym = sym->AsStackSym();
        }
    }

    if (stackSym && stackSym->m_isSingleDef)
    {
        if (stackSym->m_instrDef == this)
        {
            stackSym->m_instrDef = nullptr;
        }
        else
        {
            Assert(oldDst->isFakeDst);
        }
    }
#if DBG
    if (oldDst->isFakeDst)
    {
        oldDst->isFakeDst = false;
    }
#endif

    oldDst->UnUse();
    this->m_dst = nullptr;

    return oldDst;
}